

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_test.cc
# Opt level: O2

void __thiscall DebugTest_CanBeChained_Test::TestBody(DebugTest_CanBeChained_Test *this)

{
  string *__lhs;
  Debug *this_00;
  char *message;
  AssertionResult gtest_ar;
  undefined1 local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_a0._0_8_ = &(this->super_DebugTest).oss;
  local_a0[8] = SUB41((uint)(this->super_DebugTest).max_debug_level >> 0x1f,0);
  __lhs = &(this->super_DebugTest).str;
  std::__cxx11::string::string((string *)&local_40,(string *)__lhs);
  this_00 = Debug::operator<<((Debug *)local_a0,&local_40);
  std::__cxx11::string::string((string *)&local_60,(string *)__lhs);
  Debug::operator<<(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,__lhs
                 ,__lhs);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"str + str","oss.str()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,&local_80
            );
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)local_a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/debug_test.cc"
               ,0x12,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(DebugTest, CanBeChained) {
  Debug(max_debug_level, oss) << str << str;
  EXPECT_EQ(str + str, oss.str());
}